

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es5503.c
# Opt level: O0

UINT8 device_start_es5503(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT32 UVar1;
  DEV_DATA devData;
  void *pvVar2;
  ES5503Chip *chip;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  devData.chipInf = calloc(1,0x358);
  if ((DEV_DATA *)devData.chipInf == (DEV_DATA *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    ((DEV_DATA *)((long)devData.chipInf + 0x18))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)devData.chipInf + 0x20))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)devData.chipInf + 0x28))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)devData.chipInf + 0x30))->chipInf = (void *)0x0;
    *(undefined4 *)&((DEV_DATA *)((long)devData.chipInf + 8))->chipInf = 0x20000;
    pvVar2 = malloc((ulong)*(uint *)&((DEV_DATA *)((long)devData.chipInf + 8))->chipInf);
    ((DEV_DATA *)((long)devData.chipInf + 0x10))->chipInf = pvVar2;
    *(UINT32 *)((long)devData.chipInf + 0x33c) = cfg->clock;
    *(UINT8 *)&((DEV_DATA *)((long)devData.chipInf + 0x340))->chipInf = cfg->flags;
    if (*(char *)&((DEV_DATA *)((long)devData.chipInf + 0x340))->chipInf == '\0') {
      *(undefined1 *)&((DEV_DATA *)((long)devData.chipInf + 0x340))->chipInf = 1;
    }
    UVar1 = pow2_mask((uint)*(byte *)&((DEV_DATA *)((long)devData.chipInf + 0x340))->chipInf);
    *(char *)((long)devData.chipInf + 0x341) = (char)UVar1;
    *(undefined1 *)&((DEV_DATA *)((long)devData.chipInf + 0x338))->chipInf = 1;
    *(uint *)((long)devData.chipInf + 0x344) =
         (*(uint *)((long)devData.chipInf + 0x33c) >> 3) /
         (*(byte *)&((DEV_DATA *)((long)devData.chipInf + 0x338))->chipInf + 2);
    es5503_set_mute_mask(devData.chipInf,0);
    *(void **)devData.chipInf = devData.chipInf;
    INIT_DEVINF(retDevInf,(DEV_DATA *)devData.chipInf,*(UINT32 *)((long)devData.chipInf + 0x344),
                &devDef);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_es5503(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	ES5503Chip *chip;

	chip = (ES5503Chip *)calloc(1, sizeof(ES5503Chip));
	if (chip == NULL)
		return 0xFF;
	
	chip->irq_func = NULL;
	chip->irq_param = NULL;
	chip->adc_func = NULL;
	chip->adc_param = NULL;
	
	chip->dramsize = 0x20000;	// 128 KB
	chip->docram = (UINT8*)malloc(chip->dramsize);
	chip->clock = cfg->clock;

	chip->output_channels = cfg->flags;
	if (! chip->output_channels)
		chip->output_channels = 1;
	chip->outchn_mask = (UINT8)pow2_mask(chip->output_channels);

	chip->oscsenabled = 1;
	chip->output_rate = (chip->clock/8)/(2+chip->oscsenabled);  // (input clock / 8) / # of oscs. enabled + 2
	
	es5503_set_mute_mask(chip, 0x00000000);
	
	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, chip->output_rate, &devDef);
	
	return 0x00;
}